

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::functype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  string_view expected;
  undefined1 local_d8 [8];
  MaybeResult<wasm::Ok> parsedParams;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  string local_90;
  undefined1 local_70 [8];
  MaybeResult<unsigned_long> parsedResults;
  MaybeResult<unsigned_long> _val_1;
  
  expected._M_str = "func";
  expected._M_len = 4;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar3) {
    params<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_d8,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70,
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d8);
    if (parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      puVar1 = (undefined1 *)
               ((long)&_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 8);
      parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
                 local_70,(long)parsedResults.val.
                                super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                _M_u._M_first._M_storage + (long)local_70);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      if ((undefined1 *)
          parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ == puVar1) {
        *puVar2 = CONCAT71(_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                           _9_7_,_val_1.val.
                                 super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 _M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._9_7_,
                      _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_1_)
        ;
      }
      ((_Uninitialized<unsigned_long,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (unsigned_long)
           _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
           _M_storage;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
      results<wasm::WATParser::ParseDeclsCtx>((MaybeResult<unsigned_long> *)local_70,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                      ((long)&parsedResults.val.
                              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
                      (_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_70);
      if (_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
      {
        parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = &local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                   parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_,
                   (long)_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                         _M_first._M_storage +
                   parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        if ((undefined8 *)
            parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ == &local_a0) {
          *puVar2 = local_a0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_98
          ;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) = local_a0;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_a8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&parsedResults.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&parsedResults.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20));
        bVar3 = Lexer::takeRParen(&ctx->in);
        if (bVar3) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"expected end of functype","");
          Lexer::err((Err *)((long)&parsedResults.val.
                                    super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                            0x20),&ctx->in,&local_90);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          puVar1 = (undefined1 *)
                   ((long)&_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 8);
          if ((undefined1 *)
              parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ == puVar1) {
            *puVar2 = CONCAT71(_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               _M_u._9_7_,
                               _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>.
                               _M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                            _9_7_,_val_1.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>
                                  ._M_u._8_1_);
          }
          ((_Uninitialized<unsigned_long,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (unsigned_long)
               _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
               _M_storage;
          _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
          _M_storage = (_Uninitialized<unsigned_long,_true>)0;
          _val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_70);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}